

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

size_t fts3MatchinfoSize(MatchInfo *pInfo,char cArg)

{
  int iVar1;
  int iVar2;
  undefined3 in_register_00000031;
  
  iVar2 = CONCAT31(in_register_00000031,cArg);
  if (0x6b < iVar2) {
    switch(iVar2) {
    case 0x6c:
    case 0x73:
      goto switchD_001dc74f_caseD_6c;
    case 0x6e:
    case 0x70:
      return 1;
    default:
      if (iVar2 == 0x79) {
        iVar1 = pInfo->nCol;
        iVar2 = pInfo->nPhrase;
        goto LAB_001dc79b;
      }
    case 0x6d:
    case 0x6f:
    case 0x71:
    case 0x72:
switchD_001dc74f_caseD_6d:
      return (long)(pInfo->nCol * pInfo->nPhrase * 3);
    }
  }
  if (iVar2 == 0x61) {
switchD_001dc74f_caseD_6c:
    return (long)pInfo->nCol;
  }
  if (iVar2 == 0x62) {
    iVar1 = pInfo->nCol + 0x1f;
    iVar2 = pInfo->nCol + 0x3e;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    iVar1 = pInfo->nPhrase;
    iVar2 = iVar2 >> 5;
LAB_001dc79b:
    return (long)iVar2 * (long)iVar1;
  }
  if (iVar2 == 99) {
    return 1;
  }
  goto switchD_001dc74f_caseD_6d;
}

Assistant:

static size_t fts3MatchinfoSize(MatchInfo *pInfo, char cArg){
  size_t nVal;                      /* Number of integers output by cArg */

  switch( cArg ){
    case FTS3_MATCHINFO_NDOC:
    case FTS3_MATCHINFO_NPHRASE: 
    case FTS3_MATCHINFO_NCOL: 
      nVal = 1;
      break;

    case FTS3_MATCHINFO_AVGLENGTH:
    case FTS3_MATCHINFO_LENGTH:
    case FTS3_MATCHINFO_LCS:
      nVal = pInfo->nCol;
      break;

    case FTS3_MATCHINFO_LHITS:
      nVal = pInfo->nCol * pInfo->nPhrase;
      break;

    case FTS3_MATCHINFO_LHITS_BM:
      nVal = pInfo->nPhrase * ((pInfo->nCol + 31) / 32);
      break;

    default:
      assert( cArg==FTS3_MATCHINFO_HITS );
      nVal = pInfo->nCol * pInfo->nPhrase * 3;
      break;
  }

  return nVal;
}